

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator.cc
# Opt level: O3

string * grpc_java_generator::anon_unknown_0::MixedLower
                   (string *__return_storage_ptr__,string *word)

{
  uint __c;
  string *psVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  tolower((int)*(word->_M_dataplus)._M_p);
  psVar1 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
  uVar2 = word->_M_string_length;
  if (1 < uVar2) {
    uVar4 = 1;
    bVar3 = false;
    do {
      __c = (uint)(word->_M_dataplus)._M_p[uVar4];
      psVar1 = (string *)(ulong)__c;
      if (__c != 0x5f) {
        if (bVar3) {
          toupper(__c);
        }
        psVar1 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar2 = word->_M_string_length;
      }
      uVar4 = uVar4 + 1;
      bVar3 = __c == 0x5f;
    } while (uVar4 < uVar2);
  }
  return psVar1;
}

Assistant:

static string MixedLower(const string &word) {
  string w;
  w += static_cast<string::value_type>(tolower(word[0]));
  bool after_underscore = false;
  for (size_t i = 1; i < word.length(); ++i) {
    if (word[i] == '_') {
      after_underscore = true;
    } else {
      w += after_underscore ? static_cast<string::value_type>(toupper(word[i]))
                            : word[i];
      after_underscore = false;
    }
  }
  return w;
}